

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O3

bool __thiscall
YacclabTests::CheckFileList
          (YacclabTests *this,path *base_path,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames)

{
  pointer pcVar1;
  bool bVar2;
  path *ppVar3;
  bool bVar4;
  pointer ppVar5;
  long lVar6;
  ulong uVar7;
  error_code ec;
  path local_b0;
  error_category *local_90;
  path *local_88;
  path local_80;
  long *local_60 [2];
  long local_50 [2];
  error_code local_40;
  
  ppVar5 = (filenames->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((filenames->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppVar5) {
    bVar4 = true;
  }
  else {
    local_88 = base_path;
    local_90 = (error_category *)std::_V2::system_category();
    bVar4 = true;
    lVar6 = 0;
    uVar7 = 0;
    do {
      local_40._M_value = 0;
      local_40._M_cat = local_90;
      filesystem::path::path(&local_80,(string *)((long)&(ppVar5->first)._M_dataplus._M_p + lVar6));
      pcVar1 = (local_88->path_)._M_dataplus._M_p;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar1,pcVar1 + (local_88->path_)._M_string_length);
      ppVar3 = filesystem::path::operator/=((path *)local_60,&local_80);
      local_b0.path_._M_dataplus._M_p = (pointer)&local_b0.path_.field_2;
      pcVar1 = (ppVar3->path_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + (ppVar3->path_)._M_string_length);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      bVar2 = filesystem::exists(&local_b0,&local_40);
      (&((filenames->
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->second)[lVar6] = bVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.path_._M_dataplus._M_p != &local_b0.path_.field_2) {
        operator_delete(local_b0.path_._M_dataplus._M_p,
                        local_b0.path_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.path_._M_dataplus._M_p != &local_80.path_.field_2) {
        operator_delete(local_80.path_._M_dataplus._M_p,
                        local_80.path_.field_2._M_allocated_capacity + 1);
      }
      ppVar5 = (filenames->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = (bool)(bVar4 & (&ppVar5->second)[lVar6]);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar7 < (ulong)(((long)(filenames->
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 3)
                            * -0x3333333333333333));
  }
  return bVar4;
}

Assistant:

bool YacclabTests::CheckFileList(const path& base_path, std::vector<std::pair<std::string, bool>>& filenames)
{
    bool ret = true;
    for (size_t i = 0; i < filenames.size(); ++i) {
        std::error_code ec;
        filenames[i].second = filesystem::exists(base_path / path(filenames[i].first), ec);
        if (!filenames[i].second) {
            ret = false;
        }
    }
    return ret;
}